

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O2

bool __thiscall SQBlob::GrowBufOf(SQBlob *this,SQInteger n)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long n_00;
  
  lVar2 = this->_size;
  lVar1 = lVar2 + n;
  bVar3 = true;
  if (this->_allocated < lVar1) {
    n_00 = lVar2 * 2;
    if (lVar1 != n_00 && SBORROW8(lVar1,n_00) == lVar1 + lVar2 * -2 < 0) {
      n_00 = lVar1;
    }
    bVar3 = Resize(this,n_00);
  }
  this->_size = this->_size + n;
  return bVar3;
}

Assistant:

bool GrowBufOf(SQInteger n)
    {
        bool ret = true;
        if(_size + n > _allocated) {
            if(_size + n > _size * 2)
                ret = Resize(_size + n);
            else
                ret = Resize(_size * 2);
        }
        _size = _size + n;
        return ret;
    }